

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void __thiscall Block<float>::generate_values(Block<float> *this,size_t n,float min_,float max_)

{
  reference pvVar1;
  vector<float,_std::allocator<float>_> *in_RSI;
  undefined4 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  size_t i;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  vector<float,_std::allocator<float>_> *local_20;
  
  *in_RDI = in_XMM0_Da;
  in_RDI[1] = in_XMM1_Da;
  std::vector<float,_std::allocator<float>_>::resize(in_RSI,CONCAT44(in_XMM0_Da,in_XMM1_Da));
  for (local_20 = (vector<float,_std::allocator<float>_> *)0x0; local_20 < in_RSI;
      local_20 = (vector<float,_std::allocator<float>_> *)
                 ((long)&(local_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    in_stack_ffffffffffffffd4 = random<float>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 2),(size_type)local_20);
    *pvVar1 = in_stack_ffffffffffffffd4;
  }
  return;
}

Assistant:

void            generate_values(size_t n, T min_, T max_)
  {
    min = min_;
    max = max_;

    values.resize(n);
    for (size_t i = 0; i < n; ++i)
      values[i] = random<Value>(min, max);
  }